

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O3

void helper_pcmpistri_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s,uint32_t ctrl)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  
  lVar4 = 0;
  if ((ctrl & 1) == 0) {
    do {
      if (s->_b_ZMMReg[lVar4] == '\0') goto LAB_005121bd;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x10);
    lVar4 = 0x10;
  }
  else {
    do {
      if (s->_w_ZMMReg[lVar4] == 0) goto LAB_005121bd;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
    lVar4 = 8;
  }
LAB_005121bd:
  lVar5 = 0;
  if ((ctrl & 1) == 0) {
    do {
      if (d->_b_ZMMReg[lVar5] == '\0') goto LAB_005121f5;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x10);
    lVar5 = 0x10;
  }
  else {
    do {
      if (d->_w_ZMMReg[lVar5] == 0) goto LAB_005121f5;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 8);
    lVar5 = 8;
  }
LAB_005121f5:
  uVar2 = pcmpxstrx(env,d,s,(byte)ctrl,(int)lVar4,(int)lVar5);
  if (uVar2 == 0) {
    uVar3 = 0x10 >> ((byte)ctrl & 1);
  }
  else {
    uVar1 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    uVar3 = 0;
    if (uVar2 != 0) {
      for (; (uVar2 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
      }
    }
    if ((ctrl & 0x40) != 0) {
      uVar3 = uVar1;
    }
  }
  env->regs[1] = (ulong)uVar3;
  return;
}

Assistant:

void glue(helper_pcmpistri, SUFFIX)(CPUX86State *env, Reg *d, Reg *s,
                                    uint32_t ctrl)
{
    unsigned int res = pcmpxstrx(env, d, s, ctrl,
                                 pcmp_ilen(s, ctrl),
                                 pcmp_ilen(d, ctrl));

    if (res) {
        env->regs[R_ECX] = (ctrl & (1 << 6)) ? 31 - clz32(res) : ctz32(res);
    } else {
        env->regs[R_ECX] = 16 >> (ctrl & (1 << 0));
    }
}